

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_secp256k1.cpp
# Opt level: O2

void __thiscall
Secp256k1_CombinePubkeySecp256k1EcTest_Test::TestBody
          (Secp256k1_CombinePubkeySecp256k1EcTest_Test *this)

{
  pointer paVar1;
  bool bVar2;
  void *pvVar3;
  char *message;
  pointer paVar4;
  AssertionResult gtest_ar;
  AssertHelper local_b0;
  Secp256k1 secp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  CombinePubkeyTestVector test_vector;
  ByteData actual;
  
  pvVar3 = (void *)wally_get_secp_context();
  cfd::core::Secp256k1::Secp256k1(&secp,pvVar3);
  paVar1 = combine_test_vectors.
           super__Vector_base<CombinePubkeyTestVector,_std::allocator<CombinePubkeyTestVector>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (paVar4 = combine_test_vectors.
                super__Vector_base<CombinePubkeyTestVector,_std::allocator<CombinePubkeyTestVector>_>
                ._M_impl.super__Vector_impl_data._M_start; paVar4 != paVar1; paVar4 = paVar4 + 1) {
    anon_struct_56_2_5c921040::CombinePubkeyTestVector(&test_vector,paVar4);
    cfd::core::ByteData::ByteData(&actual);
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      bVar2 = testing::internal::AlwaysTrue();
      if (bVar2) {
        cfd::core::Secp256k1::CombinePubkeySecp256k1Ec((vector *)&local_a0);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&actual,&local_a0);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a0);
      }
    }
    else {
      testing::Message::Message((Message *)&local_a0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_secp256k1.cpp"
                 ,99,
                 "Expected: actual = secp.CombinePubkeySecp256k1Ec(test_vector.pubkeys) doesn\'t throw an exception.\n  Actual: it throws."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_a0);
    }
    cfd::core::ByteData::GetHex_abi_cxx11_();
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              ((internal *)&gtest_ar,"test_vector.expect","actual.GetHex()",&test_vector.expect,
               &local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_a0);
      message = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_secp256k1.cpp"
                 ,100,message);
      testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_b0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_a0);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&actual);
    anon_struct_56_2_5c921040::~CombinePubkeyTestVector(&test_vector);
  }
  return;
}

Assistant:

TEST(Secp256k1, CombinePubkeySecp256k1EcTest) {
  struct secp256k1_context_struct *cxt = wally_get_secp_context();
  Secp256k1 secp = Secp256k1(cxt);
  for (CombinePubkeyTestVector test_vector : combine_test_vectors) {
    ByteData actual;
    EXPECT_NO_THROW(
        actual = secp.CombinePubkeySecp256k1Ec(test_vector.pubkeys));
    EXPECT_EQ(test_vector.expect, actual.GetHex());
  }
}